

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

int xmlNodeBufGetContent(xmlBufferPtr buffer,xmlNode *cur)

{
  uint uVar1;
  uint uVar2;
  xmlBufPtr buf;
  
  if (buffer == (xmlBufferPtr)0x0 || cur == (xmlNode *)0x0) {
    return -1;
  }
  buf = xmlBufFromBuffer(buffer);
  uVar1 = xmlBufGetNodeContent(buf,cur);
  uVar2 = xmlBufBackToBuffer(buf,buffer);
  return (int)(uVar2 | uVar1) >> 0x1f;
}

Assistant:

int
xmlNodeBufGetContent(xmlBufferPtr buffer, const xmlNode *cur)
{
    xmlBufPtr buf;
    int ret1, ret2;

    if ((cur == NULL) || (buffer == NULL)) return(-1);
    buf = xmlBufFromBuffer(buffer);
    ret1 = xmlBufGetNodeContent(buf, cur);
    ret2 = xmlBufBackToBuffer(buf, buffer);
    if ((ret1 < 0) || (ret2 < 0))
        return(-1);
    return(0);
}